

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_compress1X_usingCTable_internal_bmi2
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  BIT_CStream_t bitC;
  BIT_CStream_t local_48;
  
  if (7 < dstSize) {
    local_48.bitContainer = 0;
    local_48.bitPos = 0;
    local_48.endPtr = (char *)((long)dst + (dstSize - 8));
    if (dstSize != 8) {
      uVar3 = srcSize & 0xfffffffffffffffc;
      local_48.startPtr = (char *)dst;
      local_48.ptr = (char *)dst;
      switch((uint)srcSize & 3) {
      case 0:
        while (uVar3 != 0) {
          bVar1 = *(byte *)((long)src + (uVar3 - 1));
          BIT_addBitsFast(&local_48,(ulong)CTable[bVar1].val,(uint)CTable[bVar1].nbBits);
          bVar1 = *(byte *)((long)src + (uVar3 - 2));
          BIT_addBitsFast(&local_48,(ulong)CTable[bVar1].val,(uint)CTable[bVar1].nbBits);
          bVar1 = *(byte *)((long)src + (uVar3 - 3));
          BIT_addBitsFast(&local_48,(ulong)CTable[bVar1].val,(uint)CTable[bVar1].nbBits);
          uVar3 = uVar3 - 4;
switchD_0015019d_caseD_1:
          BIT_addBitsFast(&local_48,(ulong)CTable[*(byte *)((long)src + uVar3)].val,
                          (uint)CTable[*(byte *)((long)src + uVar3)].nbBits);
          BIT_flushBits(&local_48);
        }
        sVar2 = BIT_closeCStream(&local_48);
        return sVar2;
      case 1:
        goto switchD_0015019d_caseD_1;
      case 3:
        bVar1 = *(byte *)((long)src + uVar3 + 2);
        BIT_addBitsFast(&local_48,(ulong)CTable[bVar1].val,(uint)CTable[bVar1].nbBits);
      }
      bVar1 = *(byte *)((long)src + uVar3 + 1);
      BIT_addBitsFast(&local_48,(ulong)CTable[bVar1].val,(uint)CTable[bVar1].nbBits);
      goto switchD_0015019d_caseD_1;
    }
  }
  return 0;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    size_t n;
    BIT_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = BIT_initCStream(&bitC, op, oend-op);
      if (HUF_isError(initErr)) return 0; }

    n = srcSize & ~3;  /* join to mod 4 */
    switch (srcSize & 3)
    {
        case 3 : HUF_encodeSymbol(&bitC, ip[n+ 2], CTable);
                 HUF_FLUSHBITS_2(&bitC);
		 /* fall-through */
        case 2 : HUF_encodeSymbol(&bitC, ip[n+ 1], CTable);
                 HUF_FLUSHBITS_1(&bitC);
		 /* fall-through */
        case 1 : HUF_encodeSymbol(&bitC, ip[n+ 0], CTable);
                 HUF_FLUSHBITS(&bitC);
		 /* fall-through */
        case 0 : /* fall-through */
        default: break;
    }

    for (; n>0; n-=4) {  /* note : n&3==0 at this stage */
        HUF_encodeSymbol(&bitC, ip[n- 1], CTable);
        HUF_FLUSHBITS_1(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 2], CTable);
        HUF_FLUSHBITS_2(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 3], CTable);
        HUF_FLUSHBITS_1(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 4], CTable);
        HUF_FLUSHBITS(&bitC);
    }

    return BIT_closeCStream(&bitC);
}